

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O0

seq_t * rdr_readseq(rdr_t *rdr,FILE *file,_Bool lbl)

{
  byte bVar1;
  raw_t *raw_00;
  byte in_DL;
  rdr_t *in_RSI;
  rdr_t *in_RDI;
  seq_t *seq;
  raw_t *raw;
  undefined7 in_stack_ffffffffffffffe0;
  undefined8 local_8;
  
  bVar1 = in_DL & 1;
  raw_00 = rdr_readraw(in_RSI,(FILE *)(CONCAT17(in_DL,in_stack_ffffffffffffffe0) & 0x1ffffffffffffff
                                      ));
  if (raw_00 == (raw_t *)0x0) {
    local_8 = (seq_t *)0x0;
  }
  else {
    local_8 = rdr_raw2seq(in_RDI,raw_00,(_Bool)(bVar1 & 1));
    rdr_freeraw((raw_t *)local_8);
  }
  return local_8;
}

Assistant:

seq_t *rdr_readseq(rdr_t *rdr, FILE *file, bool lbl) {
	raw_t *raw = rdr_readraw(rdr, file);
	if (raw == NULL)
		return NULL;
	seq_t *seq = rdr_raw2seq(rdr, raw, lbl);
	rdr_freeraw(raw);
	return seq;
}